

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::getLeaveVals2
          (SPxSolverBase<double> *this,double leaveMax,SPxId enterId,double *enterBound,
          double *newUBbound,double *newLBbound,double *newCoPrhs,StableSum<double> *objChange)

{
  SPxBasisBase<double> *this_00;
  int iVar1;
  Status SVar2;
  pointer pdVar3;
  double *pdVar4;
  Status *pSVar5;
  VectorBase<double> *pVVar6;
  ostream *poVar7;
  SPxInternalCodeException *pSVar8;
  long lVar9;
  double dVar10;
  allocator local_69;
  double *local_68;
  double local_60;
  string local_58;
  SPxId enterId_local;
  
  this_00 = &this->super_SPxBasisBase<double>;
  *enterBound = 0.0;
  local_68 = newLBbound;
  local_60 = leaveMax;
  enterId_local = enterId;
  if (enterId.super_DataKey.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_58,&enterId_local);
    iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,(DataKey *)&local_58);
    lVar9 = (long)iVar1;
    switch((this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar9]) {
    case D_FREE:
      pVVar6 = &this->theURbound;
      if (local_60 *
          (this->thePvec->thedelta).super_VectorBase<double>.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9] < 0.0) {
        pVVar6 = &this->theLRbound;
      }
      *newCoPrhs = (pVVar6->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
      pdVar4 = (double *)infinity();
      *newUBbound = *pdVar4;
      pdVar4 = (double *)infinity();
      *local_68 = -*pdVar4;
      pSVar5 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_0018f260;
    case D_ON_UPPER:
      goto switchD_0018eeaf_caseD_2;
    case D_ON_LOWER:
switchD_0018eeaf_caseD_4:
      pdVar4 = (double *)infinity();
      *newUBbound = *pdVar4;
      *local_68 = 0.0;
      (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar9] = P_ON_UPPER;
      pdVar3 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      goto LAB_0018f169;
    case D_ON_BOTH:
      if (0.0 <= local_60 *
                 (this->thePvec->thedelta).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar9]) goto switchD_0018eeaf_caseD_4;
      goto switchD_0018eeaf_caseD_2;
    case P_FIXED:
      poVar7 = std::operator<<((ostream *)&std::cerr,"ELEAVE54 ");
      poVar7 = std::operator<<(poVar7,"ERROR! Tried to put a fixed row variable into the basis: ");
      poVar7 = std::operator<<(poVar7,"idx=");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar1);
      std::operator<<(poVar7,", lhs=");
      poVar7 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar9]);
      std::operator<<(poVar7,", rhs=");
      poVar7 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar9]);
      std::endl<char,std::char_traits<char>>(poVar7);
      pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XLEAVE05 This should never happen.",&local_69);
      SPxInternalCodeException::SPxInternalCodeException(pSVar8,&local_58);
      __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XLEAVE06 This should never happen.",&local_69);
      SPxInternalCodeException::SPxInternalCodeException(pSVar8,&local_58);
      __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar2 = SPxBasisBase<double>::dualRowStatus(this_00,iVar1);
      (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar9] = SVar2;
      local_60 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar9];
      pdVar4 = (double *)infinity();
      dVar10 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9];
      if (local_60 < *pdVar4) {
        (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] = dVar10;
      }
      *newCoPrhs = dVar10;
      *local_68 = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
      pdVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *newUBbound = -pdVar3[lVar9];
      break;
    case P_ON_UPPER:
      SVar2 = SPxBasisBase<double>::dualRowStatus(this_00,iVar1);
      (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar9] = SVar2;
      local_60 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar9];
      pdVar4 = (double *)infinity();
      dVar10 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9];
      if (-*pdVar4 < local_60) {
        (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] = dVar10;
      }
      *newCoPrhs = dVar10;
      *newUBbound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
      pdVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *local_68 = -pdVar3[lVar9];
      break;
    case P_FREE:
      pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XLEAVE04 This should never happen.",&local_69);
      SPxInternalCodeException::SPxInternalCodeException(pSVar8,&local_58);
      __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    *enterBound = -pdVar3[lVar9];
    dVar10 = *newCoPrhs * pdVar3[lVar9];
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_58,&enterId_local);
    iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,(DataKey *)&local_58);
    lVar9 = (long)iVar1;
    switch((this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar9]) {
    case D_FREE:
      pdVar4 = (double *)infinity();
      *newUBbound = *pdVar4;
      pdVar4 = (double *)infinity();
      *local_68 = -*pdVar4;
      *newCoPrhs = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar9];
      pSVar5 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_0018f260:
      pSVar5[lVar9] = P_FIXED;
      return;
    case D_ON_LOWER:
switchD_0018eded_caseD_4:
      pdVar4 = (double *)infinity();
      *newUBbound = *pdVar4;
      *local_68 = 0.0;
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar9] = P_ON_UPPER;
      pdVar3 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      goto LAB_0018f169;
    case D_ON_BOTH:
      if (0.0 <= local_60 *
                 (this->theCoPvec->thedelta).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar9]) goto switchD_0018eded_caseD_4;
    case D_ON_UPPER:
      *newUBbound = 0.0;
      pdVar4 = (double *)infinity();
      *local_68 = -*pdVar4;
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar9] = P_ON_LOWER;
      pdVar3 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_0018f169:
      *newCoPrhs = pdVar3[lVar9];
      return;
    case P_FIXED:
      poVar7 = std::operator<<((ostream *)&std::cerr,"ELEAVE56 ");
      poVar7 = std::operator<<(poVar7,"ERROR! Tried to put a fixed column variable into the basis. "
                              );
      poVar7 = std::operator<<(poVar7,"idx=");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar1);
      std::operator<<(poVar7,", lower=");
      poVar7 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar9]);
      std::operator<<(poVar7,", upper=");
      poVar7 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar9]);
      std::endl<char,std::char_traits<char>>(poVar7);
      pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XLEAVE07 This should never happen.",&local_69);
      SPxInternalCodeException::SPxInternalCodeException(pSVar8,&local_58);
      __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XLEAVE08 This should never happen.",&local_69);
      SPxInternalCodeException::SPxInternalCodeException(pSVar8,&local_58);
      __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar2 = SPxBasisBase<double>::dualColStatus(this_00,iVar1);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar9] = SVar2;
      local_60 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar9];
      pdVar4 = (double *)infinity();
      dVar10 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9];
      if (local_60 < *pdVar4) {
        (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] = dVar10;
      }
      *newCoPrhs = dVar10;
      *newUBbound = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9];
      dVar10 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar9];
      *local_68 = dVar10;
      break;
    case P_ON_UPPER:
      SVar2 = SPxBasisBase<double>::dualColStatus(this_00,iVar1);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar9] = SVar2;
      local_60 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar9];
      pdVar4 = (double *)infinity();
      dVar10 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9];
      if (-*pdVar4 < local_60) {
        (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] = dVar10;
      }
      *newCoPrhs = dVar10;
      pdVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *newUBbound = pdVar3[lVar9];
      *local_68 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9];
      dVar10 = pdVar3[lVar9];
      break;
    case P_FREE:
      SVar2 = SPxBasisBase<double>::dualColStatus(this_00,iVar1);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar9] = SVar2;
      pVVar6 = &this->theLCbound;
      if (0.0 < local_60 *
                (this->thePvec->thedelta).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar9]) {
        pVVar6 = &this->theUCbound;
      }
      *newCoPrhs = (pVVar6->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
      *newUBbound = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9];
      *local_68 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9];
      *enterBound = 0.0;
      return;
    }
    *enterBound = dVar10;
    dVar10 = dVar10 * *newCoPrhs;
  }
  StableSum<double>::operator-=(objChange,dVar10);
  return;
switchD_0018eeaf_caseD_2:
  *newUBbound = 0.0;
  pdVar4 = (double *)infinity();
  *local_68 = -*pdVar4;
  (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar9] = P_ON_LOWER;
  pdVar3 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  goto LAB_0018f169;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals2(
   R leaveMax,
   SPxId enterId,
   R& enterBound,
   R& newUBbound,
   R& newLBbound,
   R& newCoPrhs,
   StableSum<R>& objChange
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   enterBound = 0;

   if(enterId.isSPxRowId())
   {
      int idx = this->number(SPxRowId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);

         if(thePvec->delta()[idx] * leaveMax < 0)
            newCoPrhs = theLRbound[idx];
         else
            newCoPrhs = theURbound[idx];

         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLRbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theURbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * thePvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLRbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theURbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->lhs(idx) > R(-infinity))
            theURbound[idx] = theLRbound[idx];

         newCoPrhs = theLRbound[idx];        // slack !!
         newUBbound = -this->lhs(idx);
         newLBbound = -this->rhs(idx);
         enterBound = -this->rhs(idx);
         objChange -= newCoPrhs * this->rhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->rhs(idx) < R(infinity))
            theLRbound[idx] = theURbound[idx];

         newCoPrhs = theURbound[idx];        // slack !!
         newLBbound = -this->rhs(idx);
         newUBbound = -this->lhs(idx);
         enterBound = -this->lhs(idx);
         objChange -= newCoPrhs * this->lhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XLEAVE04 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "ELEAVE53 ERROR: not yet debugged!" << std::endl;)
         ds.rowStatus(idx) = this->dualRowStatus(idx);
         newCoPrhs = theURbound[idx];        // slack !!
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         enterBound = 0;
#endif
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE54 "
                       << "ERROR! Tried to put a fixed row variable into the basis: "
                       << "idx="   << idx
                       << ", lhs=" << this->lhs(idx)
                       << ", rhs=" << this->rhs(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE05 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE06 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(enterId.isSPxColId());
      int idx = this->number(SPxColId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theUCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         newCoPrhs = theLCbound[idx];
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * theCoPvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLCbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theUCbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::lower(idx) > R(-infinity))
            theLCbound[idx] = theUCbound[idx];

         newCoPrhs = theUCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::upper(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::upper(idx) < R(infinity))
            theUCbound[idx] = theLCbound[idx];

         newCoPrhs = theLCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::lower(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(thePvec->delta()[idx] * leaveMax > 0)
            newCoPrhs = theUCbound[idx];
         else
            newCoPrhs = theLCbound[idx];

         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = 0;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE56 "
                       << "ERROR! Tried to put a fixed column variable into the basis. "
                       << "idx="     << idx
                       << ", lower=" << this->lower(idx)
                       << ", upper=" << this->upper(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE07 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE08 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.colStatus(idx), objChange);
   }

}